

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Oric.cpp
# Opt level: O2

void __thiscall
Oric::ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)3,_(CPU::MOS6502Esque::Type)1>
::perform_special_key
          (ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)3,_(CPU::MOS6502Esque::Type)1>
           *this,Key key)

{
  uint8_t *puVar1;
  size_t in_RCX;
  int iVar2;
  undefined6 in_register_00000032;
  
  iVar2 = (int)CONCAT62(in_register_00000032,key);
  if (iVar2 == 0xfffd) {
    if ((this->m6502_).
        super_Processor<(CPU::MOS6502::Personality)1,_Oric::ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)3,_(CPU::MOS6502Esque::Type)1>,_false>
        .super_ProcessorBase.super_ProcessorStorage.nmi_line_is_enabled_ == false) {
      puVar1 = &(this->m6502_).
                super_Processor<(CPU::MOS6502::Personality)1,_Oric::ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)3,_(CPU::MOS6502Esque::Type)1>,_false>
                .super_ProcessorBase.super_ProcessorStorage.interrupt_requests_;
      *puVar1 = *puVar1 | 0x20;
    }
    (this->m6502_).
    super_Processor<(CPU::MOS6502::Personality)1,_Oric::ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)3,_(CPU::MOS6502Esque::Type)1>,_false>
    .super_ProcessorBase.super_ProcessorStorage.nmi_line_is_enabled_ = false;
  }
  else if (iVar2 == 0xfffc) {
    Jasmin::write(&this->jasmin_,0x3fa,(void *)0x0,in_RCX);
    Jasmin::write(&this->jasmin_,0x3fb,(void *)0x1,in_RCX);
    puVar1 = &(this->m6502_).
              super_Processor<(CPU::MOS6502::Personality)1,_Oric::ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)3,_(CPU::MOS6502Esque::Type)1>,_false>
              .super_ProcessorBase.super_ProcessorStorage.interrupt_requests_;
    *puVar1 = *puVar1 | 0x10;
  }
  return;
}

Assistant:

void perform_special_key(Oric::Key key) final {
			switch(key) {
				default: break;

				case KeyJasminReset:
					jasmin_.write(0x3fa, 0);
					jasmin_.write(0x3fb, 1);
					m6502_.set_power_on(true);
				break;

				case KeyNMI:
					// As luck would have it, the 6502's NMI line is edge triggered.
					// So just forcing through an edge will work here.
					m6502_.set_nmi_line(true);
					m6502_.set_nmi_line(false);
				break;
			}
		}